

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

void __thiscall
testing::Matcher<unsigned_short>::Matcher(Matcher<unsigned_short> *this,unsigned_short value)

{
  ComparisonBase<testing::internal::EqMatcher<unsigned_short>,_unsigned_short,_testing::internal::AnyEq>
  local_32;
  Matcher<unsigned_short> local_30;
  unsigned_short local_12;
  Matcher<unsigned_short> *pMStack_10;
  unsigned_short value_local;
  Matcher<unsigned_short> *this_local;
  
  local_12 = value;
  pMStack_10 = this;
  internal::MatcherBase<unsigned_short>::MatcherBase(&this->super_MatcherBase<unsigned_short>);
  (this->super_MatcherBase<unsigned_short>)._vptr_MatcherBase = (_func_int **)&PTR__Matcher_00219810
  ;
  local_32.rhs_ = (unsigned_short)Eq<unsigned_short>(local_12);
  internal::ComparisonBase::operator_cast_to_Matcher(&local_30,(ComparisonBase *)&local_32);
  operator=(this,&local_30);
  ~Matcher(&local_30);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }